

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void concave_shell_move(CHAR_DATA *ch,int *dirptr,ROOM_INDEX_DATA *oldroom)

{
  byte *pbVar1;
  short sVar2;
  EXIT_DATA *pEVar3;
  CHAR_DATA *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  char *format;
  CHAR_DATA *ch_00;
  long bitv;
  char buf [4608];
  
  if (ch->in_room->vnum != oldroom->vnum) {
    return;
  }
  if (ch->disrupted == true) {
    format = "The shell of air dissipates with no effect.";
    pcVar8 = (char *)0x0;
    goto LAB_00311fef;
  }
  iVar7 = *dirptr;
  bitv = (long)iVar7;
  bVar5 = is_affected(ch,(int)gsn_bind_feet);
  if (bVar5) {
    send_to_char("Your feet are too tightly bound to the earth for the shell to move you.\n\r",ch);
    return;
  }
  sVar2 = ch->level;
  iVar10 = (int)sVar2;
  pcVar8 = flag_name_lookup(bitv,direction_table);
  act("The shell of air finishes forming and rushes $tward, taking you with it!",ch,pcVar8,
      (void *)0x0,3);
  act("The shell of air finishes forming and rushes $tward, taking $n with it!",ch,pcVar8,
      (void *)0x0,0);
  uVar9 = (uint)ch->comm[0];
  if ((uVar9 >> 0xc & 1) == 0) {
    ch->comm[0] = ch->comm[0] | 0x1000;
  }
  pEVar3 = ch->in_room->exit[bitv];
  if ((pEVar3 != (EXIT_DATA *)0x0) && ((pEVar3->u1).to_room != (ROOM_INDEX_DATA *)0x0)) {
    uVar11 = (uint)pEVar3->exit_info[0];
    if ((pEVar3->exit_info[0] & 2U) != 0) {
      bVar5 = is_affected_by(ch,0x14);
      if (!bVar5) goto LAB_00311fe2;
      uVar11 = (uint)pEVar3->exit_info[0];
    }
    if ((~uVar11 & 0x12) != 0) {
      if (2 < sVar2) {
        uVar11 = 1;
        do {
          move_char(ch,iVar7,true,true);
          pEVar3 = ch->in_room->exit[bitv];
          if ((pEVar3 == (EXIT_DATA *)0x0) || ((pEVar3->u1).to_room == (ROOM_INDEX_DATA *)0x0)) {
LAB_0031214e:
            send_to_char("Your rapid motion comes to a crashing halt as you strike an obstacle!\n\r"
                         ,ch);
            act("$n flies into the room and crashes into the obstruction $tward!",ch,pcVar8,
                (void *)0x0,0);
            iVar7 = dice(10,10);
            damage_new(ch,ch,iVar7,(int)gsn_bash,1,true,false,0,1,"bone-jarring collision");
            iVar7 = 0x18;
LAB_003121c4:
            WAIT_STATE(ch,iVar7);
            ch->position = 5;
            break;
          }
          uVar6 = (uint)pEVar3->exit_info[0];
          if ((pEVar3->exit_info[0] & 2U) != 0) {
            bVar5 = is_affected_by(ch,0x14);
            if (!bVar5) goto LAB_0031214e;
            uVar6 = (uint)pEVar3->exit_info[0];
          }
          if ((~uVar6 & 0x12) == 0) goto LAB_0031214e;
          pCVar4 = ch->in_room->people;
          while (ch_00 = pCVar4, ch_00 != (CHAR_DATA *)0x0) {
            pCVar4 = ch_00->next_in_room;
            bVar5 = is_npc(ch_00);
            if ((((bVar5) &&
                 (((((ch_00->act[0] & 0x20) != 0 && (ch->level + 5 <= (int)ch_00->level)) ||
                   ((ch_00->off_flags[0] & 0x800000) != 0)) &&
                  ((bVar5 = is_awake(ch_00), bVar5 && (ch_00->fighting != (CHAR_DATA *)0x0)))))) &&
                (bVar5 = can_see(ch_00,ch), bVar5)) &&
               ((bVar5 = is_affected_by(ch_00,0x16), !bVar5 &&
                ((ch->in_room->room_flags[0] & 0x400) == 0)))) {
              pcVar8 = pers(ch_00,ch);
              snprintf(buf,0x1200,"As you hurtle along, %s suddenly obstructs your path!\n\r",pcVar8
                      );
              send_to_char(buf,ch);
              iVar7 = 0xc;
              goto LAB_003121c4;
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != (((iVar10 / 3 + (iVar10 >> 0x1f)) - (iVar10 * 0x5556 >> 0x1f)) + 1U &
                           0xffff));
      }
      if ((uVar9 >> 0xc & 1) == 0) {
        pbVar1 = (byte *)((long)ch->comm + 1);
        *pbVar1 = *pbVar1 & 0xef;
      }
      return;
    }
  }
LAB_00311fe2:
  format = "Since the exit $t has become obstructed, the swirling winds dissipate.";
LAB_00311fef:
  act(format,ch,pcVar8,(void *)0x0,4);
  return;
}

Assistant:

void concave_shell_move(CHAR_DATA *ch, int *dirptr, ROOM_INDEX_DATA *oldroom)
{
	char buf[MSL];
	int i, dir, range;
	bool verbose = false, stopped = false;
	EXIT_DATA *pexit;
	char *direction;
	CHAR_DATA *wch, *wch_next;

	dir = *dirptr;

	if (ch->in_room->vnum != oldroom->vnum)
		return;

	if (ch->disrupted)
	{
		act("The shell of air dissipates with no effect.", ch, 0, 0, TO_ALL);
		return;
	}

	if (is_affected(ch, gsn_bind_feet))
	{
		send_to_char("Your feet are too tightly bound to the earth for the shell to move you.\n\r", ch);
		return;
	}

	range = ch->level / 3;

	direction = flag_name_lookup(dir, direction_table);
	act("The shell of air finishes forming and rushes $tward, taking you with it!", ch, direction, 0, TO_CHAR);
	act("The shell of air finishes forming and rushes $tward, taking $n with it!", ch, direction, 0, TO_ROOM);

	if (!IS_SET(ch->comm, COMM_BRIEF))
	{
		SET_BIT(ch->comm, COMM_BRIEF);
		verbose = true;
	}

	pexit = ch->in_room->exit[dir];

	if (pexit == nullptr
		|| pexit->u1.to_room == nullptr
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && IS_SET(pexit->exit_info, EX_NOPASS)))
	{
		act("Since the exit $t has become obstructed, the swirling winds dissipate.", ch, direction, 0, TO_ALL);
		return;
	}

	for (i = 1; i <= range; i++)
	{
		move_char(ch, dir, true, true);

		pexit = ch->in_room->exit[dir];

		if (pexit == nullptr
			|| pexit->u1.to_room == nullptr
			|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
			|| (IS_SET(pexit->exit_info, EX_CLOSED) && IS_SET(pexit->exit_info, EX_NOPASS)))
		{
			send_to_char("Your rapid motion comes to a crashing halt as you strike an obstacle!\n\r", ch);
			act("$n flies into the room and crashes into the obstruction $tward!", ch, direction, 0, TO_ROOM);

			damage_new(ch, ch, dice(10, 10), gsn_bash, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "bone-jarring collision");
			WAIT_STATE(ch, PULSE_VIOLENCE * 2);

			ch->position = POS_RESTING;
			break;
		}

		for (wch = ch->in_room->people; wch != nullptr; wch = wch_next)
		{
			wch_next = wch->next_in_room;

			if (is_npc(wch)
				&& ((IS_SET(wch->act, ACT_AGGRESSIVE) && wch->level >= ch->level + 5)
					|| IS_SET(wch->off_flags, SPAM_MURDER))
				&& is_awake(wch)
				&& wch->fighting != nullptr
				&& can_see(wch, ch)
				&& !is_affected_by(wch, AFF_CALM)
				&& !IS_SET(ch->in_room->room_flags, ROOM_SAFE))
			{
				std::snprintf(buf, static_cast<size_t>(MSL), "As you hurtle along, %s suddenly obstructs your path!\n\r", pers(wch, ch));
				send_to_char(buf, ch);

				WAIT_STATE(ch, PULSE_VIOLENCE);

				ch->position = POS_RESTING;
				stopped = true;
				break;
			}
		}

		if (stopped)
			break;
	}

	if (verbose)
		REMOVE_BIT(ch->comm, COMM_BRIEF);
}